

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psac.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  size_type *psVar3;
  size_type *psVar4;
  _Alloc_hider _Var5;
  char **ppcVar6;
  int iVar7;
  ostream *poVar8;
  long lVar9;
  size_t max_local_size;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  long lVar11;
  string local_str;
  comm local_680;
  int argc_local;
  double local_658;
  env e;
  comm comm;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  sa;
  char **argv_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  SwitchArg checkArg;
  SwitchArg lcpArg;
  ValueArg<int> seedArg;
  MPI_Errhandler errhandler;
  _Alloc_hider local_2f8;
  ompi_errhandler_t local_2f0 [8];
  char local_2e8 [16];
  _Alloc_hider local_2d8;
  char local_2c8 [16];
  _Alloc_hider local_2b8;
  char local_2a8 [24];
  _Alloc_hider local_290;
  char local_280 [40];
  _Alloc_hider local_258 [2];
  mxx local_248 [16];
  _Alloc_hider local_238;
  char local_228 [16];
  _Alloc_hider local_218;
  char local_208 [24];
  ValueArg<unsigned_long> randArg;
  CmdLine cmd;
  
  argc_local = argc;
  argv_local = argv;
  mxx::env::env(&e,&argc_local,&argv_local);
  MPI_Comm_create_errhandler(mxx::my_mpi_errorhandler,&errhandler);
  MPI_Comm_set_errhandler(&ompi_mpi_comm_world,errhandler);
  comm._vptr_comm = (_func_int **)&PTR__comm_00150508;
  comm.mpi_comm = (MPI_Comm)&ompi_mpi_comm_world;
  MPI_Comm_size(&ompi_mpi_comm_world);
  MPI_Comm_rank(comm.mpi_comm);
  comm.do_free = false;
  errhandler = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&errhandler,"Parallel distirbuted suffix array and LCP construction.","");
  psVar2 = &randArg.super_Arg._flag._M_string_length;
  randArg.super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&randArg,"none","");
  TCLAP::CmdLine::CmdLine(&cmd,(string *)&errhandler,' ',(string *)&randArg,true);
  if (randArg.super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(randArg.super_Arg._vptr_Arg);
  }
  if (errhandler != local_2f0) {
    operator_delete(errhandler);
  }
  randArg.super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&randArg,"f","");
  psVar3 = &seedArg.super_Arg._flag._M_string_length;
  seedArg.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&seedArg,"file","");
  sa._vptr_suffix_array = (_func_int **)&sa.local_size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sa,"Input filename.","");
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"");
  psVar4 = &lcpArg.super_Arg._flag._M_string_length;
  lcpArg.super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lcpArg,"filename","");
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&errhandler,(string *)&randArg,(string *)&seedArg,(string *)&sa,true,&local_548,
             (string *)&lcpArg,(Visitor *)0x0);
  if (lcpArg.super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(lcpArg.super_Arg._vptr_Arg);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p);
  }
  if (sa._vptr_suffix_array != (_func_int **)&sa.local_size) {
    operator_delete(sa._vptr_suffix_array);
  }
  if (seedArg.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(seedArg.super_Arg._vptr_Arg);
  }
  if (randArg.super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(randArg.super_Arg._vptr_Arg);
  }
  seedArg.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&seedArg,"r","");
  sa._vptr_suffix_array = (_func_int **)&sa.local_size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sa,"random","");
  lcpArg.super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lcpArg,"Random input size","");
  psVar2 = &checkArg.super_Arg._flag._M_string_length;
  checkArg.super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&checkArg,"size","");
  TCLAP::ValueArg<unsigned_long>::ValueArg
            (&randArg,(string *)&seedArg,(string *)&sa,(string *)&lcpArg,true,0,(string *)&checkArg,
             (Visitor *)0x0);
  if (checkArg.super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(checkArg.super_Arg._vptr_Arg);
  }
  if (lcpArg.super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(lcpArg.super_Arg._vptr_Arg);
  }
  if (sa._vptr_suffix_array != (_func_int **)&sa.local_size) {
    operator_delete(sa._vptr_suffix_array);
  }
  if (seedArg.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(seedArg.super_Arg._vptr_Arg);
  }
  seedArg.super_Arg._vptr_Arg = (_func_int **)0x0;
  seedArg.super_Arg._flag._M_dataplus._M_p = (pointer)0x0;
  seedArg.super_Arg._flag._M_string_length = 0;
  sa._vptr_suffix_array = (_func_int **)&errhandler;
  std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>::_M_realloc_insert<TCLAP::Arg*>
            ((vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>> *)&seedArg,(iterator)0x0,(Arg **)&sa);
  sa._vptr_suffix_array = (_func_int **)&randArg;
  if (seedArg.super_Arg._flag._M_dataplus._M_p == (pointer)seedArg.super_Arg._flag._M_string_length)
  {
    std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>::_M_realloc_insert<TCLAP::Arg*>
              ((vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>> *)&seedArg,
               (iterator)seedArg.super_Arg._flag._M_dataplus._M_p,(Arg **)&sa);
  }
  else {
    *(ValueArg<unsigned_long> **)seedArg.super_Arg._flag._M_dataplus._M_p = &randArg;
    seedArg.super_Arg._flag._M_dataplus._M_p = seedArg.super_Arg._flag._M_dataplus._M_p + 8;
  }
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[5])(&cmd,&seedArg);
  if (seedArg.super_Arg._vptr_Arg != (_func_int **)0x0) {
    operator_delete(seedArg.super_Arg._vptr_Arg);
  }
  sa._vptr_suffix_array = (_func_int **)&sa.local_size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sa,"s","");
  lcpArg.super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lcpArg,"seed","");
  checkArg.super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&checkArg,"Sets the seed for the ranom input generation","");
  paVar1 = &local_str.field_2;
  local_str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_str,"int","");
  TCLAP::ValueArg<int>::ValueArg
            (&seedArg,(string *)&sa,(string *)&lcpArg,(string *)&checkArg,false,0,&local_str,
             (Visitor *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_str._M_dataplus._M_p != paVar1) {
    operator_delete(local_str._M_dataplus._M_p);
  }
  if (checkArg.super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(checkArg.super_Arg._vptr_Arg);
  }
  if (lcpArg.super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(lcpArg.super_Arg._vptr_Arg);
  }
  if (sa._vptr_suffix_array != (_func_int **)&sa.local_size) {
    operator_delete(sa._vptr_suffix_array);
  }
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&seedArg);
  sa._vptr_suffix_array = (_func_int **)&sa.local_size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sa,"l","");
  checkArg.super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&checkArg,"lcp","");
  local_str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_str,"Construct the LCP alongside the SA.","");
  TCLAP::Arg::Arg(&lcpArg.super_Arg,(string *)&sa,(string *)&checkArg,&local_str,false,false,
                  (Visitor *)0x0);
  lcpArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_001502d0;
  lcpArg.super_Arg._163_2_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_str._M_dataplus._M_p != paVar1) {
    operator_delete(local_str._M_dataplus._M_p);
  }
  if (checkArg.super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(checkArg.super_Arg._vptr_Arg);
  }
  if (sa._vptr_suffix_array != (_func_int **)&sa.local_size) {
    operator_delete(sa._vptr_suffix_array);
  }
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&lcpArg);
  sa._vptr_suffix_array = (_func_int **)&sa.local_size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sa,"c","");
  local_str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_str,"check","");
  local_680._vptr_comm = (_func_int **)&local_680.m_size;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_680,"Check correctness of SA (and LCP).","");
  max_local_size = 0;
  TCLAP::Arg::Arg(&checkArg.super_Arg,(string *)&sa,&local_str,(string *)&local_680,false,false,
                  (Visitor *)0x0);
  checkArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_001502d0;
  checkArg.super_Arg._163_2_ = 0;
  if (local_680._vptr_comm != (_func_int **)&local_680.m_size) {
    operator_delete(local_680._vptr_comm);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_str._M_dataplus._M_p != paVar1) {
    operator_delete(local_str._M_dataplus._M_p);
  }
  if (sa._vptr_suffix_array != (_func_int **)&sa.local_size) {
    operator_delete(sa._vptr_suffix_array);
  }
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&checkArg);
  ppcVar6 = argv_local;
  lVar9 = (long)argc_local;
  local_str._M_dataplus._M_p = (pointer)0x0;
  local_str._M_string_length = 0;
  local_str.field_2._M_allocated_capacity = 0;
  if (0 < lVar9) {
    lVar11 = 0;
    do {
      std::__cxx11::string::string((string *)&sa,ppcVar6[lVar11],(allocator *)&local_680);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sa);
      if (sa._vptr_suffix_array != (_func_int **)&sa.local_size) {
        operator_delete(sa._vptr_suffix_array);
      }
      lVar11 = lVar11 + 1;
    } while (lVar9 != lVar11);
  }
  TCLAP::CmdLine::parse
            (&cmd,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_str);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_str);
  local_str._M_dataplus._M_p = (pointer)&local_str.field_2;
  local_str._M_string_length = 0;
  local_str.field_2._M_allocated_capacity =
       local_str.field_2._M_allocated_capacity & 0xffffffffffffff00;
  iVar7 = std::__cxx11::string::compare((char *)local_258);
  if (iVar7 == 0) {
    rand_dna_abi_cxx11_((string *)&sa,randArg._value / (ulong)(long)comm.m_size,
                        comm.m_rank * seedArg.super_Arg._164_4_);
    std::__cxx11::string::operator=((string *)&local_str,(string *)&sa);
    if (sa._vptr_suffix_array == (_func_int **)&sa.local_size) goto LAB_0011c713;
  }
  else {
    mxx::file_block_decompose_abi_cxx11_
              ((string *)&sa,(mxx *)local_258[0]._M_p,&ompi_mpi_comm_world,(MPI_Comm)0x0,
               max_local_size);
    std::__cxx11::string::operator=((string *)&local_str,(string *)&sa);
    if (sa._vptr_suffix_array == (_func_int **)&sa.local_size) goto LAB_0011c713;
  }
  operator_delete(sa._vptr_suffix_array);
LAB_0011c713:
  lVar9 = std::chrono::_V2::steady_clock::now();
  lVar11 = std::chrono::_V2::steady_clock::now();
  _Var5 = local_str._M_dataplus;
  local_658 = (double)(lVar11 - lVar9) / 1000000.0;
  if (lcpArg.super_Arg._163_1_ == '\x01') {
    _Var10._M_current = local_str._M_dataplus._M_p + local_str._M_string_length;
    local_680._vptr_comm = (_func_int **)&PTR__comm_00150508;
    local_680.mpi_comm = (MPI_Comm)&ompi_mpi_comm_world;
    local_680.do_free = false;
    MPI_Comm_size(&ompi_mpi_comm_world);
    MPI_Comm_rank(local_680.mpi_comm);
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
    ::suffix_array(&sa,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )_Var5._M_p,_Var10,&local_680);
    mxx::comm::~comm(&local_680);
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
    ::construct(&sa,true,0);
    lVar11 = std::chrono::_V2::steady_clock::now();
    if (comm.m_rank == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"PSAC time: ",0xb);
      poVar8 = std::ostream::_M_insert<double>((double)(lVar11 - lVar9) / 1000000.0 - local_658);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ms",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    _Var5._M_p = local_str._M_dataplus._M_p;
    if (checkArg.super_Arg._163_1_ == '\x01') {
      _Var10._M_current = local_str._M_dataplus._M_p + local_str._M_string_length;
      local_680._vptr_comm = (_func_int **)&PTR__comm_00150508;
      local_680.mpi_comm = (MPI_Comm)&ompi_mpi_comm_world;
      local_680.do_free = false;
      MPI_Comm_size(&ompi_mpi_comm_world);
      MPI_Comm_rank(local_680.mpi_comm);
      gl_check_correct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
                (&sa,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )_Var5._M_p,_Var10,&local_680);
      mxx::comm::~comm(&local_680);
    }
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
    ::~suffix_array(&sa);
  }
  else {
    _Var10._M_current = local_str._M_dataplus._M_p + local_str._M_string_length;
    local_680._vptr_comm = (_func_int **)&PTR__comm_00150508;
    local_680.mpi_comm = (MPI_Comm)&ompi_mpi_comm_world;
    local_680.do_free = false;
    MPI_Comm_size(&ompi_mpi_comm_world);
    MPI_Comm_rank(local_680.mpi_comm);
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
    ::suffix_array((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                    *)&sa,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )_Var5._M_p,_Var10,&local_680);
    mxx::comm::~comm(&local_680);
    suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>::
    construct_arr<2ul>((suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                        *)&sa,true);
    lVar11 = std::chrono::_V2::steady_clock::now();
    if (comm.m_rank == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"PSAC time: ",0xb);
      poVar8 = std::ostream::_M_insert<double>((double)(lVar11 - lVar9) / 1000000.0 - local_658);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ms",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    _Var5._M_p = local_str._M_dataplus._M_p;
    if (checkArg.super_Arg._163_1_ == '\x01') {
      _Var10._M_current = local_str._M_dataplus._M_p + local_str._M_string_length;
      local_680._vptr_comm = (_func_int **)&PTR__comm_00150508;
      local_680.mpi_comm = (MPI_Comm)&ompi_mpi_comm_world;
      local_680.do_free = false;
      MPI_Comm_size(&ompi_mpi_comm_world);
      MPI_Comm_rank(local_680.mpi_comm);
      gl_check_correct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                  *)&sa,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )_Var5._M_p,_Var10,&local_680);
      mxx::comm::~comm(&local_680);
    }
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
    ::~suffix_array((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                     *)&sa);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_str._M_dataplus._M_p != &local_str.field_2) {
    operator_delete(local_str._M_dataplus._M_p);
  }
  checkArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00150178;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)checkArg.super_Arg._requireLabel._M_dataplus._M_p !=
      &checkArg.super_Arg._requireLabel.field_2) {
    operator_delete(checkArg.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)checkArg.super_Arg._description._M_dataplus._M_p !=
      &checkArg.super_Arg._description.field_2) {
    operator_delete(checkArg.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)checkArg.super_Arg._name._M_dataplus._M_p != &checkArg.super_Arg._name.field_2) {
    operator_delete(checkArg.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)checkArg.super_Arg._flag._M_dataplus._M_p != &checkArg.super_Arg._flag.field_2) {
    operator_delete(checkArg.super_Arg._flag._M_dataplus._M_p);
  }
  lcpArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00150178;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lcpArg.super_Arg._requireLabel._M_dataplus._M_p != &lcpArg.super_Arg._requireLabel.field_2)
  {
    operator_delete(lcpArg.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lcpArg.super_Arg._description._M_dataplus._M_p != &lcpArg.super_Arg._description.field_2) {
    operator_delete(lcpArg.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lcpArg.super_Arg._name._M_dataplus._M_p != &lcpArg.super_Arg._name.field_2) {
    operator_delete(lcpArg.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lcpArg.super_Arg._flag._M_dataplus._M_p != &lcpArg.super_Arg._flag.field_2) {
    operator_delete(lcpArg.super_Arg._flag._M_dataplus._M_p);
  }
  seedArg.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_00150658;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)seedArg._typeDesc._M_dataplus._M_p != &seedArg._typeDesc.field_2) {
    operator_delete(seedArg._typeDesc._M_dataplus._M_p);
  }
  seedArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00150178;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)seedArg.super_Arg._requireLabel._M_dataplus._M_p !=
      &seedArg.super_Arg._requireLabel.field_2) {
    operator_delete(seedArg.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)seedArg.super_Arg._description._M_dataplus._M_p != &seedArg.super_Arg._description.field_2)
  {
    operator_delete(seedArg.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)seedArg.super_Arg._name._M_dataplus._M_p != &seedArg.super_Arg._name.field_2) {
    operator_delete(seedArg.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)seedArg.super_Arg._flag._M_dataplus._M_p != &seedArg.super_Arg._flag.field_2) {
    operator_delete(seedArg.super_Arg._flag._M_dataplus._M_p);
  }
  randArg.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_00150760;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)randArg._typeDesc._M_dataplus._M_p != &randArg._typeDesc.field_2) {
    operator_delete(randArg._typeDesc._M_dataplus._M_p);
  }
  randArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00150178;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)randArg.super_Arg._requireLabel._M_dataplus._M_p !=
      &randArg.super_Arg._requireLabel.field_2) {
    operator_delete(randArg.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)randArg.super_Arg._description._M_dataplus._M_p != &randArg.super_Arg._description.field_2)
  {
    operator_delete(randArg.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)randArg.super_Arg._name._M_dataplus._M_p != &randArg.super_Arg._name.field_2) {
    operator_delete(randArg.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)randArg.super_Arg._flag._M_dataplus._M_p != &randArg.super_Arg._flag.field_2) {
    operator_delete(randArg.super_Arg._flag._M_dataplus._M_p);
  }
  errhandler = (MPI_Errhandler)&PTR__ValueArg_001507f8;
  if (local_218._M_p != local_208) {
    operator_delete(local_218._M_p);
  }
  if (local_238._M_p != local_228) {
    operator_delete(local_238._M_p);
  }
  if ((mxx *)local_258[0]._M_p != local_248) {
    operator_delete(local_258[0]._M_p);
  }
  errhandler = (MPI_Errhandler)&PTR__Arg_00150178;
  if (local_290._M_p != local_280) {
    operator_delete(local_290._M_p);
  }
  if (local_2b8._M_p != local_2a8) {
    operator_delete(local_2b8._M_p);
  }
  if (local_2d8._M_p != local_2c8) {
    operator_delete(local_2d8._M_p);
  }
  if (local_2f8._M_p != local_2e8) {
    operator_delete(local_2f8._M_p);
  }
  TCLAP::CmdLine::~CmdLine(&cmd);
  mxx::comm::~comm(&comm);
  mxx::env::~env(&e);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    // set up MPI
    //MPI_Init(&argc, &argv);
    //int rank, p;
    //MPI_Comm_rank(MPI_COMM_WORLD, &rank);
    //MPI_Comm_size(MPI_COMM_WORLD, &p);
    mxx::env e(argc, argv);
    mxx::env::set_exception_on_error();
    mxx::comm comm = mxx::comm();

    try {
    // define commandline usage
    TCLAP::CmdLine cmd("Parallel distirbuted suffix array and LCP construction.");
    TCLAP::ValueArg<std::string> fileArg("f", "file", "Input filename.", true, "", "filename");
    TCLAP::ValueArg<std::size_t> randArg("r", "random", "Random input size", true, 0, "size");
    cmd.xorAdd(fileArg, randArg);
    TCLAP::ValueArg<int> seedArg("s", "seed", "Sets the seed for the ranom input generation", false, 0, "int");
    cmd.add(seedArg);
    TCLAP::SwitchArg  lcpArg("l", "lcp", "Construct the LCP alongside the SA.", false);
    cmd.add(lcpArg);
    TCLAP::SwitchArg  checkArg("c", "check", "Check correctness of SA (and LCP).", false);
    cmd.add(checkArg);
    cmd.parse(argc, argv);

    // read input file or generate input on master processor
    // block decompose input file
    std::string local_str;
    if (fileArg.getValue() != "") {
        local_str = mxx::file_block_decompose(fileArg.getValue().c_str(), MPI_COMM_WORLD);
    } else {
        // TODO proper distributed random!
        local_str = rand_dna(randArg.getValue()/comm.size(), seedArg.getValue() * comm.rank());
    }

    // TODO differentiate between index types

    // run our distributed suffix array construction
    mxx::timer t;
    double start = t.elapsed();
    if (lcpArg.getValue()) {
        // construct with LCP
        suffix_array<std::string::iterator, index_t, true> sa(local_str.begin(), local_str.end(), MPI_COMM_WORLD);
        // TODO choose construction method
        sa.construct(true);
        double end = t.elapsed() - start;
        if (comm.rank() == 0)
            std::cerr << "PSAC time: " << end << " ms" << std::endl;
        if (checkArg.getValue()) {
            gl_check_correct(sa, local_str.begin(), local_str.end(), MPI_COMM_WORLD);
        }
    } else {
        // construct without LCP
        suffix_array<std::string::iterator, index_t, false> sa(local_str.begin(), local_str.end(), MPI_COMM_WORLD);
        // TODO choose construction method
        sa.construct_arr<2>(true);
        double end = t.elapsed() - start;
        if (comm.rank() == 0)
            std::cerr << "PSAC time: " << end << " ms" << std::endl;
        if (checkArg.getValue()) {
            gl_check_correct(sa, local_str.begin(), local_str.end(), MPI_COMM_WORLD);
        }
    }

    // catch any TCLAP exception
    } catch (TCLAP::ArgException& e) {
        std::cerr << "error: " << e.error() << " for arg " << e.argId() << std::endl;
        exit(EXIT_FAILURE);
    }

    // finalize MPI
    //MPI_Finalize();

    return 0;
}